

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QImage>::appendInitialize(QArrayDataPointer<QImage> *this,qsizetype newSize)

{
  QImage *pQVar1;
  QImageData *in_RSI;
  QImage *in_RDI;
  QImage *e;
  QImage *b;
  
  begin((QArrayDataPointer<QImage> *)0x8c4d80);
  pQVar1 = begin((QArrayDataPointer<QImage> *)0x8c4d96);
  std::uninitialized_value_construct<QImage*>(pQVar1 + (long)in_RSI,in_RDI);
  in_RDI->d = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }